

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O2

char * StringFromBinary(LPBYTE pbBinary,size_t cbBinary,char *szBuffer)

{
  char *pcVar1;
  char *szSaveBuffer;
  size_t sVar2;
  
  pcVar1 = szBuffer;
  if (cbBinary != 0 && pbBinary != (LPBYTE)0x0) {
    for (sVar2 = 0; cbBinary != sVar2; sVar2 = sVar2 + 1) {
      *szBuffer = IntToHexChar[pbBinary[sVar2] >> 4];
      ((uchar *)szBuffer)[1] = IntToHexChar[pbBinary[sVar2] & 0xf];
      szBuffer = (char *)((uchar *)szBuffer + 2);
    }
  }
  *szBuffer = '\0';
  return pcVar1;
}

Assistant:

char * StringFromBinary(LPBYTE pbBinary, size_t cbBinary, char * szBuffer)
{
    char * szSaveBuffer = szBuffer;

    // Verify the binary pointer
    if(pbBinary && cbBinary)
    {
        // Convert the string to the array of MD5
        // Copy the blob data as text
        for(size_t i = 0; i < cbBinary; i++)
        {
            *szBuffer++ = IntToHexChar[pbBinary[0] >> 0x04];
            *szBuffer++ = IntToHexChar[pbBinary[0] & 0x0F];
            pbBinary++;
        }
    }

    // Terminate the string
    *szBuffer = 0;
    return szSaveBuffer;
}